

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O3

ssize_t __thiscall RoboClaw::read(RoboClaw *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  ssize_t sVar4;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  uint8_t value;
  undefined1 local_2d;
  int local_2c;
  double local_28;
  undefined1 auVar5 [64];
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  auVar5._8_56_ = extraout_var;
  auVar5._0_8_ = extraout_XMM0_Qa;
  auVar1 = vcvtusi2sd_avx512f(auVar5._0_16_,__fd);
  local_28 = auVar1._0_8_;
  do {
    local_2c = 0;
    ioctl(this->m_serial,0x541b,&local_2c);
    if (local_2c != 0) {
      local_2d = 0;
      if (this->m_serial != 0) {
        sVar4 = ::read(this->m_serial,&local_2d,1);
        return CONCAT71((int7)((ulong)sVar4 >> 8),local_2d);
      }
      return 0;
    }
    lVar3 = std::chrono::_V2::steady_clock::now();
  } while (((double)(lVar3 - lVar2) * 1000.0) / 1000000000.0 < local_28);
  return CONCAT71((int7)((ulong)(lVar3 - lVar2) >> 8),0xff);
}

Assistant:

uint8_t RoboClaw::read(uint32_t timeout)
{
    if( m_serial )
    {
        auto start = std::chrono::steady_clock::now();

        // Empty buffer?
        while( !available() )
        {
            auto end = std::chrono::steady_clock::now();
            auto elapsed = end-start;
            if( elapsed.count() * 1000.0 / std::chrono::steady_clock::period().den >= timeout )
            {
                return -1;
            }
        }
        return read();
    }
}